

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall FIX::Initiator::initialize(Initiator *this)

{
  SessionID *sessionID;
  SessionSettings *this_00;
  bool bVar1;
  Dictionary *pDVar2;
  Session *pSVar3;
  mapped_type *ppSVar4;
  _Base_ptr p_Var5;
  ConfigError *pCVar6;
  allocator<char> local_101;
  Initiator *local_100;
  Sessions *local_f8;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *local_f0;
  string local_e8;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  undefined1 local_98 [32];
  _Rb_tree_node_base local_78;
  size_t local_58;
  string local_50;
  
  this_00 = &this->m_settings;
  SessionSettings::getSessions(&sessions,this_00);
  if (sessions._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"No sessions defined",(allocator<char> *)&local_e8);
    ConfigError::ConfigError(pCVar6,(string *)local_98);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,Exception::~Exception);
  }
  local_98._16_8_ = this->m_pLogFactory;
  local_98._0_4_ = *(undefined4 *)&this->m_application;
  local_98._4_4_ = *(undefined4 *)((long)&this->m_application + 4);
  local_98._8_4_ = *(undefined4 *)&this->m_messageStoreFactory;
  local_98._12_4_ = *(undefined4 *)((long)&this->m_messageStoreFactory + 4);
  local_78._M_left = &local_78;
  local_78._M_color = _S_red;
  local_78._M_parent = (_Base_ptr)0x0;
  local_58 = 0;
  local_f0 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
              *)&this->m_sessionIDs;
  local_f8 = &this->m_sessions;
  local_100 = this;
  local_78._M_right = local_78._M_left;
  for (p_Var5 = sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &sessions._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    sessionID = (SessionID *)(p_Var5 + 1);
    pDVar2 = SessionSettings::get(this_00,sessionID);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ConnectionType",&local_101);
    Dictionary::getString(&local_e8,pDVar2,&local_50,false);
    bVar1 = std::operator==(&local_e8,"initiator");
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      std::
      _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
      ::_M_insert_unique<FIX::SessionID_const&>(local_f0,sessionID);
      pDVar2 = SessionSettings::get(this_00,sessionID);
      pSVar3 = SessionFactory::create((SessionFactory *)local_98,sessionID,pDVar2);
      ppSVar4 = std::
                map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                ::operator[](local_f8,sessionID);
      *ppSVar4 = pSVar3;
      setDisconnected(local_100,sessionID);
    }
  }
  if ((local_100->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    SessionFactory::~SessionFactory((SessionFactory *)local_98);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&sessions._M_t);
    return;
  }
  pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"No sessions defined for initiator",(allocator<char> *)&local_50);
  ConfigError::ConfigError(pCVar6,&local_e8);
  __cxa_throw(pCVar6,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

void Initiator::initialize() EXCEPT ( ConfigError )
{
  std::set < SessionID > sessions = m_settings.getSessions();
  std::set < SessionID > ::iterator i;

  if ( !sessions.size() )
    throw ConfigError( "No sessions defined" );

  SessionFactory factory( m_application, m_messageStoreFactory,
                          m_pLogFactory );

  for ( i = sessions.begin(); i != sessions.end(); ++i )
  {
    if ( m_settings.get( *i ).getString( "ConnectionType" ) == "initiator" )
    {
      m_sessionIDs.insert( *i );
      m_sessions[ *i ] = factory.create( *i, m_settings.get( *i ) );
      setDisconnected( *i );
    }
  }

  if ( !m_sessions.size() )
    throw ConfigError( "No sessions defined for initiator" );
}